

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O0

CTypeID lj_ccall_ctid_vararg(CTState *cts,cTValue *o)

{
  CType *pCVar1;
  CType *s;
  CTypeID id;
  cTValue *o_local;
  CTState *cts_local;
  
  if ((uint)((int)(o->field_4).it >> 0xf) < 0xfffffff3) {
    cts_local._0_4_ = 0xe;
  }
  else if ((int)(o->field_4).it >> 0xf == -0xb) {
    cts_local._0_4_ = (CTypeID)*(ushort *)((o->u64 & 0x7fffffffffff) + 10);
    pCVar1 = cts->tab + (CTypeID)cts_local;
    if ((pCVar1->info & 0xfc000000) == 0x30000000) {
      cts_local._0_4_ = lj_ctype_intern(cts,(pCVar1->info & 0xffff | 0x30000) + 0x20000000,8);
    }
    else if ((pCVar1->info >> 0x1c == 1) || (pCVar1->info >> 0x1c == 6)) {
      cts_local._0_4_ = lj_ctype_intern(cts,((CTypeID)cts_local | 0x30000) + 0x20000000,8);
    }
    else if (((pCVar1->info & 0xf4000000) == 0x4000000) && (pCVar1->size == 4)) {
      cts_local._0_4_ = 0xe;
    }
  }
  else if ((int)(o->field_4).it >> 0xf == -5) {
    cts_local._0_4_ = 0x13;
  }
  else if (((int)(o->field_4).it >> 0xf == -2) || ((int)(o->field_4).it >> 0xf == -3)) {
    cts_local._0_4_ = 3;
  }
  else {
    cts_local._0_4_ = 0x11;
  }
  return (CTypeID)cts_local;
}

Assistant:

CTypeID lj_ccall_ctid_vararg(CTState *cts, cTValue *o)
{
  if (tvisnumber(o)) {
    return CTID_DOUBLE;
  } else if (tviscdata(o)) {
    CTypeID id = cdataV(o)->ctypeid;
    CType *s = ctype_get(cts, id);
    if (ctype_isrefarray(s->info)) {
      return lj_ctype_intern(cts,
	       CTINFO(CT_PTR, CTALIGN_PTR|ctype_cid(s->info)), CTSIZE_PTR);
    } else if (ctype_isstruct(s->info) || ctype_isfunc(s->info)) {
      /* NYI: how to pass a struct by value in a vararg argument? */
      return lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|id), CTSIZE_PTR);
    } else if (ctype_isfp(s->info) && s->size == sizeof(float)) {
      return CTID_DOUBLE;
    } else {
      return id;
    }
  } else if (tvisstr(o)) {
    return CTID_P_CCHAR;
  } else if (tvisbool(o)) {
    return CTID_BOOL;
  } else {
    return CTID_P_VOID;
  }
}